

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int is_civetweb_webdav_method(mg_connection *conn)

{
  char *__s1;
  int iVar1;
  byte local_21;
  char *s;
  mg_connection *conn_local;
  
  if ((conn == (mg_connection *)0x0) ||
     (__s1 = (conn->request_info).request_method, __s1 == (char *)0x0)) {
    conn_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(__s1,"PROPFIND");
    local_21 = 1;
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"PROPPATCH");
      local_21 = 1;
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"LOCK");
        local_21 = 1;
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1,"UNLOCK");
          local_21 = 1;
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1,"MOVE");
            local_21 = 1;
            if (iVar1 != 0) {
              iVar1 = strcmp(__s1,"COPY");
              local_21 = iVar1 != 0 ^ 0xff;
            }
          }
        }
      }
    }
    conn_local._4_4_ = (uint)(local_21 & 1);
  }
  return conn_local._4_4_;
}

Assistant:

static int
is_civetweb_webdav_method(const struct mg_connection *conn)
{
	/* Note: Here we only have to identify the WebDav methods that need special
	 * handling in the CivetWeb code - not all methods used in WebDav. In
	 * particular, methods used on directories (when using Windows Explorer as
	 * WebDav client).
	 */
	if (conn) {
		const char *s = conn->request_info.request_method;
		if (s != NULL) {
			/* These are the civetweb builtin DAV methods */
			return (!strcmp(s, "PROPFIND") || !strcmp(s, "PROPPATCH")
			        || !strcmp(s, "LOCK") || !strcmp(s, "UNLOCK")
			        || !strcmp(s, "MOVE") || !strcmp(s, "COPY"));
		}
	}
	return 0;
}